

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcMechanicalFastenerType::~IfcMechanicalFastenerType
          (IfcMechanicalFastenerType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)
   &(this->super_IfcFastenerType).super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.super_IfcTypeObject = 0x85bcd0;
  *(undefined8 *)&(this->super_IfcFastenerType).field_0x1b0 = 0x85bd98;
  *(undefined8 *)
   &(this->super_IfcFastenerType).super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.super_IfcTypeObject.field_0x88 = 0x85bcf8;
  (this->super_IfcFastenerType).super_IfcElementComponentType.super_IfcElementType.
  super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x85bd20;
  *(undefined8 *)
   &(this->super_IfcFastenerType).super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 = 0x85bd48;
  *(undefined8 *)
   &(this->super_IfcFastenerType).super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.field_0x148 = 0x85bd70;
  puVar1 = *(undefined1 **)
            &(this->super_IfcFastenerType).super_IfcElementComponentType.super_IfcElementType.
             super_IfcTypeProduct.field_0x158;
  if (puVar1 != &(this->super_IfcFastenerType).super_IfcElementComponentType.super_IfcElementType.
                 field_0x168) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this,&PTR_construction_vtable_24__0085b8a0);
  operator_delete(this);
  return;
}

Assistant:

IfcMechanicalFastenerType() : Object("IfcMechanicalFastenerType") {}